

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O3

bool vera::intersection(Line *_A,Line *_B,vec3 *_p,float _threshold)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar1 = (_A->m_direction).field_2.z;
  fVar11 = (_B->m_direction).field_2.z;
  uVar2 = (_A->m_direction).field_0;
  uVar6 = (_A->m_direction).field_1;
  uVar3 = _A->m_points[0].field_0;
  uVar7 = _A->m_points[0].field_1;
  fVar13 = _B->m_points[0].field_1.y - (float)uVar7;
  fVar10 = _A->m_points[0].field_2.z;
  uVar4 = (_B->m_direction).field_0;
  uVar8 = (_B->m_direction).field_1;
  fVar14 = _B->m_points[0].field_2.z - fVar10;
  fVar15 = _B->m_points[0].field_0.x - (float)uVar3;
  fVar12 = (float)uVar6 * fVar11 - fVar1 * (float)uVar8;
  fVar16 = fVar1 * (float)uVar4 - (float)uVar2 * fVar11;
  fVar17 = (float)uVar2 * (float)uVar8 - (float)uVar6 * (float)uVar4;
  if (((ABS(fVar17 * fVar14 + fVar16 * fVar13 + fVar15 * fVar12) <= _threshold) &&
      (fVar11 = (((float)uVar8 * fVar15 + fVar13 * -(float)uVar4) * fVar17 +
                (fVar11 * fVar13 + -(float)uVar8 * fVar14) * fVar12 +
                ((float)uVar4 * fVar14 + fVar15 * -fVar11) * fVar16) /
                (fVar17 * fVar17 + fVar12 * fVar12 + fVar16 * fVar16), 0.0 <= fVar11)) &&
     (fVar11 <= 1.0)) {
    fVar12 = (float)uVar3 + (float)uVar2 * fVar11;
    fVar13 = (float)uVar7 + (float)uVar6 * fVar11;
    fVar10 = fVar10 + fVar1 * fVar11;
    _p->field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar12;
    _p->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)fVar13;
    (_p->field_2).z = fVar10;
    fVar15 = fVar12 - _B->m_points[0].field_0.x;
    fVar12 = fVar12 - _B->m_points[1].field_0.x;
    fVar11 = fVar13 - _B->m_points[0].field_1.y;
    fVar13 = fVar13 - _B->m_points[1].field_1.y;
    fVar14 = fVar10 - _B->m_points[0].field_2.z;
    fVar10 = fVar10 - _B->m_points[1].field_2.z;
    fVar1 = (_B->m_direction).field_0.x;
    uVar5 = (_B->m_direction).field_1;
    uVar9 = (_B->m_direction).field_2;
    if (fVar10 * fVar10 + fVar13 * fVar13 + fVar12 * fVar12 +
        fVar14 * fVar14 + fVar11 * fVar11 + fVar15 * fVar15 <=
        (float)uVar9 * (float)uVar9 + fVar1 * fVar1 + (float)uVar5 * (float)uVar5 + 0.001) {
      return true;
    }
  }
  return false;
}

Assistant:

bool intersection(const Line& _A, const Line& _B, glm::vec3& _p, float _threshold ) {
    // Unnormalized direction of the ray
    glm::vec3 da = _A.getDireciton();
    glm::vec3 db = _B.getDireciton();
    glm::vec3 dc = _B[0] - _A[0];
    glm::vec3 cross_da_db = glm::cross(da, db);
    
    // lines are not coplanar
    if ( std::abs( glm::dot(dc, cross_da_db)) > _threshold)
        return false;
        
    // Means we have an intersection
    float s = glm::dot( glm::cross(dc, db),  cross_da_db) / glm::length2( cross_da_db );
    if (s >= 0.0 && s <= 1.0) {
        _p = _A[0] + da * s;
        
        // See if this lies on the segment
        if ( (glm::length2(_p - _B[0]) + glm::length2(_p - _B[1])) <= (glm::length2(_B.getDireciton()) + lengthErrorThreshold) )
            return true;
    }

    return false;
}